

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

long __thiscall
gl4cts::anon_unknown_0::AdvancedPipelineComputeChain::Run(AdvancedPipelineComputeChain *this)

{
  CallLogWrapper *this_00;
  GLuint *textures;
  pointer *ppMVar1;
  float fVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  pointer pMVar7;
  bool bVar8;
  GLuint GVar9;
  pointer __dest;
  void *pvVar10;
  long lVar11;
  stringstream *psVar12;
  float *__s;
  undefined8 *pixels;
  ulong uVar13;
  float *pfVar14;
  int row;
  long lVar15;
  float *pfVar16;
  int row_1;
  bool *compile_error;
  long lVar17;
  ulong uVar18;
  undefined8 uVar19;
  stringstream *psVar20;
  allocator_type *__a;
  value_type_conflict1 *__val_3;
  int row_2;
  long lVar21;
  value_type_conflict5 *__val_1;
  value_type_conflict1 *__val;
  allocator_type *__a_00;
  bool bVar22;
  undefined4 uVar23;
  float fVar24;
  float fVar25;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> data_1;
  pointer local_200;
  Matrix<float,_4,_4> res_1;
  stringstream ss;
  uint uStack_1b4;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [112];
  ios_base aiStack_138 [264];
  
  ppMVar1 = &data_1.
             super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  uVar13 = 0;
  bVar22 = false;
  do {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    local_200 = (pointer)0x239;
    data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)ppMVar1;
    __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&data_1,(ulong)&local_200);
    pMVar7 = local_200;
    data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_200;
    data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = __dest;
    memcpy(__dest,
           "\nstruct S0 {\n  int m0[8];\n};\nstruct S1 {\n  S0 m0[8];\n};\nlayout(binding = 0, std430) buffer Buffer0 {\n  int m0[5];\n  S1 m1[8];\n} g_buffer0;\nlayout(binding = 1, std430) buffer Buffer1 {\n  uint data[8];\n} g_buffer1;\nlayout(binding = 2, std430) buffer Buffer2 {\n  int data[256];\n} g_buffer2;\nlayout(binding = 3, std430) buffer Buffer3 {\n  int data[256];\n} g_buffer3;\nlayout(binding = 4, std430) buffer Buffer4 {\n  mat4 data0;\n  mat4 data1;\n} g_buffer4;\nlayout(binding = 0, rgba32f) uniform image2D g_image0;\nlayout(binding = 1, offset = 8) uniform atomic_uint g_counter[2];"
           ,0x239);
    data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pMVar7;
    *(undefined1 *)
     ((long)(pMVar7->m_data).m_data[0].m_data + (long)(__dest->m_data).m_data[0].m_data) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               (char *)data_1.
                       super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(long)pMVar7);
    if (data_1.
        super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)ppMVar1) {
      operator_delete(data_1.
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)((data_1.
                                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data).
                                    m_data[0].m_data + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "\nlayout(local_size_x = 4, local_size_y = 4, local_size_z = 4) in;\nvoid UpdateBuffer0(uvec3 id, int add_val) {\n  if (id.x < 8 && id.y < 8 && id.z < 8) {\n    g_buffer0.m1[id.z].m0[id.y].m0[id.x] += add_val;\n  }\n}\nuniform int g_add_value = 1;\nuniform uint g_counter_y = 1;\nuniform vec4 g_image_value = vec4(0.125, 0.25, 0.375, 0.5);\nvoid main() {\n  uvec3 id = gl_GlobalInvocationID;\n  UpdateBuffer0(id, 1);\n  UpdateBuffer0(id, g_add_value);\n  if (id == uvec3(1, g_counter_y, 1)) {\n    uint idx = atomicCounterIncrement(g_counter[1]);\n    g_buffer1.data[idx] = idx;\n    idx = atomicCounterIncrement(g_counter[1]);\n    g_buffer1.data[idx] = idx;\n  }\n  if (id.x < 4 && id.y < 4 && id.z == 0) {\n    vec4 v = imageLoad(g_image0, ivec2(id.xy));\n    imageStore(g_image0, ivec2(id.xy), v + g_image_value);\n  }\n  if (id.x < 2 && id.y == 0 && id.z == 0) {\n    g_buffer2.data[id.x] -= int(g_counter_y);\n  }\n}"
               ,0x37e);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::ios_base::~ios_base(aiStack_138);
    GVar9 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,(string *)&res_1)
    ;
    this->m_program[uVar13] = GVar9;
    if ((Vector<float,_4> *)res_1.m_data.m_data[0].m_data._0_8_ != res_1.m_data.m_data + 1) {
      operator_delete((void *)res_1.m_data.m_data[0].m_data._0_8_,
                      res_1.m_data.m_data[1].m_data._0_8_ + 1);
    }
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[uVar13]);
    bVar8 = ComputeShaderBase::CheckProgram
                      (&this->super_ComputeShaderBase,this->m_program[uVar13],compile_error);
    if (!bVar8) {
      if (!bVar22) {
        return -1;
      }
      break;
    }
    bVar22 = 1 < uVar13;
    uVar13 = uVar13 + 1;
  } while (uVar13 != 3);
  glu::CallLogWrapper::glGenBuffers(this_00,4,this->m_storage_buffer);
  pvVar10 = operator_new(0x814);
  memset(pvVar10,0,0x814);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer[0]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x814,pvVar10,0x88e6);
  operator_delete(pvVar10,0x814);
  local_1a8._0_8_ = (_func_int **)0x0;
  local_1a8._8_8_ = 0;
  _ss = (void *)0x0;
  uStack_1b0 = 0;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer[1]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x20,&ss,0x88e6);
  pvVar10 = operator_new(0x800);
  lVar11 = 0;
  do {
    *(undefined4 *)((long)pvVar10 + lVar11) = 7;
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x800);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[2]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x800,pvVar10,0x88e6);
  glu::CallLogWrapper::glBindBufferRange(this_00,0x90d2,2,this->m_storage_buffer[2],0,0x400);
  glu::CallLogWrapper::glBindBufferRange(this_00,0x90d2,3,this->m_storage_buffer[2],0x400,0x400);
  operator_delete(pvVar10,0x800);
  __a = (allocator_type *)&ss;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::vector
            (&data_1,2,__a);
  local_1a8._32_8_ = 0;
  local_1a8._40_8_ = 0;
  local_1a8._16_8_ = 0;
  local_1a8._24_8_ = 0;
  local_1a8._0_8_ = (_func_int **)0x0;
  local_1a8._8_8_ = 0;
  _ss = (void *)0x0;
  uStack_1b0 = 0;
  lVar11 = 0;
  lVar15 = 0;
  do {
    lVar17 = 0;
    do {
      uVar23 = 0x3f800000;
      if (lVar11 != lVar17) {
        uVar23 = 0;
      }
      *(undefined4 *)(__a + lVar17) = uVar23;
      lVar17 = lVar17 + 0x10;
    } while (lVar17 != 0x40);
    lVar15 = lVar15 + 1;
    __a = __a + 4;
    lVar11 = lVar11 + 0x10;
  } while (lVar15 != 4);
  psVar12 = &ss;
  lVar11 = 0;
  pfVar16 = (float *)data_1.
                     super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  do {
    lVar15 = 0;
    do {
      *(undefined4 *)((long)pfVar16 + lVar15) = *(undefined4 *)(psVar12 + lVar15);
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0x40);
    lVar11 = lVar11 + 1;
    pfVar16 = pfVar16 + 1;
    psVar12 = psVar12 + 4;
  } while (lVar11 != 4);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,4,this->m_storage_buffer[3]);
  glu::CallLogWrapper::glBufferData
            (this_00,0x90d2,
             (long)data_1.
                   super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)data_1.
                   super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
             data_1.
             super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0x88e6);
  if (data_1.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data_1.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)data_1.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data_1.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  _ss = (void *)0x0;
  uStack_1b0 = 0;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_counter_buffer);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,1,this->m_counter_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x92c0,0x10,&ss,0x88e6);
  pfVar16 = (float *)&data_1;
  data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __a_00 = (allocator_type *)&res_1;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&ss,0x10,
             (value_type *)pfVar16,__a_00);
  textures = &this->m_texture;
  glu::CallLogWrapper::glGenTextures(this_00,1,textures);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8814,4,4,0,0x1908,0x1406,_ss);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  if (_ss != (void *)0x0) {
    operator_delete(_ss,local_1a8._0_8_ - (long)_ss);
  }
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program[0]);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,this->m_texture,0,'\0',0,0x88ba,0x8814);
  glu::CallLogWrapper::glDispatchCompute(this_00,2,2,2);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x2020);
  glu::CallLogWrapper::glDispatchCompute(this_00,3,2,2);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program[1]);
  glu::CallLogWrapper::glDispatchCompute(this_00,4,3,7);
  glu::CallLogWrapper::glMemoryBarrier(this_00,800);
  __s = (float *)operator_new(0x100);
  memset(__s,0,0x100);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture);
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&this->m_fbo);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->m_fbo);
  glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,*textures,0);
  pixels = (undefined8 *)operator_new(0x40);
  pixels[6] = 0;
  pixels[7] = 0;
  pixels[4] = 0;
  pixels[5] = 0;
  pixels[2] = 0;
  pixels[3] = 0;
  *pixels = 0;
  pixels[1] = 0;
  glu::CallLogWrapper::glReadPixels(this_00,0,0,4,4,0x1908,0x1401,pixels);
  uVar13 = 0xfffffffffffffffc;
  do {
    bVar3 = *(byte *)((long)pixels + uVar13 + 5);
    bVar4 = *(byte *)((long)pixels + uVar13 + 6);
    bVar5 = *(byte *)((long)pixels + uVar13 + 7);
    __s[uVar13 + 4] = (float)*(byte *)((long)pixels + uVar13 + 4) / 255.0;
    __s[uVar13 + 5] = (float)bVar3 / 255.0;
    __s[uVar13 + 6] = (float)bVar4 / 255.0;
    __s[uVar13 + 7] = (float)bVar5 / 255.0;
    uVar13 = uVar13 + 4;
  } while (uVar13 < 0x3c);
  fVar2 = (this->super_ComputeShaderBase).g_color_eps.m_data[0];
  fVar24 = *__s + -0.25;
  fVar25 = -fVar24;
  if (-fVar24 <= fVar24) {
    fVar25 = fVar24;
  }
  if (fVar25 <= fVar2) {
    uVar13 = 0;
    bVar22 = false;
    pfVar14 = __s;
    do {
      fVar24 = pfVar14[1] + -0.5;
      fVar25 = -fVar24;
      if (-fVar24 <= fVar24) {
        fVar25 = fVar24;
      }
      if ((this->super_ComputeShaderBase).g_color_eps.m_data[1] < fVar25) break;
      fVar24 = pfVar14[2] + -0.75;
      fVar25 = -fVar24;
      if (-fVar24 <= fVar24) {
        fVar25 = fVar24;
      }
      if ((this->super_ComputeShaderBase).g_color_eps.m_data[2] < fVar25) break;
      fVar24 = pfVar14[3] + -1.0;
      fVar25 = -fVar24;
      if (-fVar24 <= fVar24) {
        fVar25 = fVar24;
      }
      if ((this->super_ComputeShaderBase).g_color_eps.m_data[3] < fVar25) break;
      bVar22 = 0xe < uVar13;
      if (uVar13 == 0xf) {
        operator_delete(pixels,0x40);
        operator_delete(__s,0x100);
        goto LAB_00920fa0;
      }
      fVar24 = pfVar14[4] + -0.25;
      fVar25 = -fVar24;
      if (-fVar24 <= fVar24) {
        fVar25 = fVar24;
      }
      uVar13 = uVar13 + 1;
      pfVar14 = pfVar14 + 4;
    } while (fVar25 <= fVar2);
  }
  else {
    bVar22 = false;
  }
  anon_unknown_0::Output("Invalid data at texture.\n");
  operator_delete(pixels,0x40);
  operator_delete(__s,0x100);
  if (bVar22) {
LAB_00920fa0:
    pvVar10 = operator_new(0x814);
    memset(pvVar10,0,0x814);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[0]);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x814,pvVar10);
    uVar6 = *(uint *)((long)pvVar10 + 0x14);
    if (uVar6 == 4) {
      lVar11 = 6;
      do {
        lVar15 = lVar11;
        if (lVar15 == 0x205) {
          operator_delete(pvVar10,0x814);
          goto LAB_00921147;
        }
        uVar6 = *(uint *)((long)pvVar10 + lVar15 * 4);
        lVar11 = lVar15 + 1;
      } while (uVar6 == 4);
      bVar22 = 0x203 < lVar15 - 1U;
    }
    else {
      bVar22 = false;
    }
    anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)uVar6,2);
    operator_delete(pvVar10,0x814);
    if (bVar22) {
LAB_00921147:
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[1]);
      psVar12 = &ss;
      glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x20,psVar12);
      if (_ss == 0) {
        uVar13 = 0;
        do {
          uVar18 = uVar13;
          if (uVar18 == 3) goto LAB_009211e3;
          uVar13 = uVar18 + 1;
        } while (uVar18 + 1 == (ulong)(&uStack_1b4)[uVar18]);
        anon_unknown_0::Output("Data is: %d should be: %d.\n");
        if (uVar18 < 3) {
          return -1;
        }
LAB_009211e3:
        pvVar10 = operator_new(0x800);
        memset(pvVar10,0,0x800);
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[2]);
        glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x800,pvVar10);
        lVar11 = 0;
        bVar22 = false;
        do {
          uVar6 = *(uint *)((long)pvVar10 + lVar11 * 4);
          if (uVar6 != 5) {
            uVar19 = 5;
LAB_00921295:
            anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)uVar6,uVar19);
            operator_delete(pvVar10,0x800);
            if (!bVar22) {
              return -1;
            }
            goto LAB_009212c5;
          }
          uVar6 = *(uint *)((long)pvVar10 + lVar11 * 4 + 0x400);
          if (uVar6 != 7) {
            uVar19 = 7;
            goto LAB_00921295;
          }
          lVar11 = lVar11 + 1;
          bVar22 = lVar11 != 1;
        } while (lVar11 == 1);
        operator_delete(pvVar10,0x800);
LAB_009212c5:
        lVar11 = 0;
        do {
          *(undefined8 *)(local_1a8 + lVar11 + 0x20) = 0;
          *(undefined8 *)(local_1a8 + lVar11 + 0x28) = 0;
          *(undefined8 *)(local_1a8 + lVar11 + 0x10) = 0;
          *(undefined8 *)(local_1a8 + lVar11 + 0x18) = 0;
          *(undefined8 *)(local_1a8 + lVar11) = 0;
          *(undefined8 *)(local_1a8 + lVar11 + 8) = 0;
          *(undefined8 *)(&ss + lVar11) = 0;
          *(undefined8 *)((long)&uStack_1b0 + lVar11) = 0;
          lVar15 = 0;
          lVar17 = 0;
          psVar20 = psVar12;
          do {
            lVar21 = 0;
            do {
              uVar23 = 0x3f800000;
              if (lVar15 != lVar21) {
                uVar23 = 0;
              }
              *(undefined4 *)(psVar20 + lVar21) = uVar23;
              lVar21 = lVar21 + 0x10;
            } while (lVar21 != 0x40);
            lVar17 = lVar17 + 1;
            psVar20 = psVar20 + 4;
            lVar15 = lVar15 + 0x10;
          } while (lVar17 != 4);
          lVar11 = lVar11 + 0x40;
          psVar12 = psVar12 + 0x40;
        } while (lVar11 != 0x80);
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[3]);
        glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x80,&ss);
        data_1.
        super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        data_1.
        super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        data_1.
        super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        lVar11 = 0;
        lVar15 = 0;
        do {
          lVar17 = 0;
          do {
            uVar23 = 0x3f800000;
            if (lVar11 != lVar17) {
              uVar23 = 0;
            }
            *(undefined4 *)((long)pfVar16 + lVar17) = uVar23;
            lVar17 = lVar17 + 0x10;
          } while (lVar17 != 0x40);
          lVar15 = lVar15 + 1;
          pfVar16 = pfVar16 + 1;
          lVar11 = lVar11 + 0x10;
        } while (lVar15 != 4);
        bVar22 = tcu::operator!=((Matrix<float,_4,_4> *)&ss,(Matrix<float,_4,_4> *)&data_1);
        if (!bVar22) {
          res_1.m_data.m_data[3].m_data[2] = 0.0;
          res_1.m_data.m_data[3].m_data[3] = 0.0;
          res_1.m_data.m_data[2].m_data[0] = 0.0;
          res_1.m_data.m_data[2].m_data[1] = 0.0;
          res_1.m_data.m_data[2].m_data[2] = 0.0;
          res_1.m_data.m_data[2].m_data[3] = 0.0;
          res_1.m_data.m_data[1].m_data[0] = 0.0;
          res_1.m_data.m_data[1].m_data[1] = 0.0;
          res_1.m_data.m_data[1].m_data[2] = 0.0;
          res_1.m_data.m_data[1].m_data[3] = 0.0;
          res_1.m_data.m_data[0].m_data[0] = 0.0;
          res_1.m_data.m_data[0].m_data[1] = 0.0;
          res_1.m_data.m_data[0].m_data[2] = 0.0;
          res_1.m_data.m_data[0].m_data[3] = 0.0;
          lVar11 = 0;
          lVar15 = 0;
          do {
            lVar17 = 0;
            do {
              uVar23 = 0x3f800000;
              if (lVar11 != lVar17) {
                uVar23 = 0;
              }
              *(undefined4 *)(__a_00 + lVar17) = uVar23;
              lVar17 = lVar17 + 0x10;
            } while (lVar17 != 0x40);
            lVar15 = lVar15 + 1;
            __a_00 = __a_00 + 4;
            lVar11 = lVar11 + 0x10;
          } while (lVar15 != 4);
          res_1.m_data.m_data[3].m_data[0] = 10.0;
          res_1.m_data.m_data[3].m_data[1] = 20.0;
          res_1.m_data.m_data[3].m_data[2] = 30.0;
          tcu::transpose<float,4,4>
                    ((Matrix<float,_4,_4> *)&data_1,(tcu *)&res_1,(Matrix<float,_4,_4> *)0x40);
          bVar22 = tcu::operator!=((Matrix<float,_4,_4> *)(local_1a8 + 0x30),
                                   (Matrix<float,_4,_4> *)&data_1);
          if (!bVar22) {
            _ss = (void *)0x0;
            uStack_1b0 = 0;
            glu::CallLogWrapper::glGetBufferSubData(this_00,0x92c0,0,0x10,&ss);
            uVar6 = uStack_1b0._4_4_;
            if (uStack_1b0._4_4_ != 4) {
              anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)uStack_1b0._4_4_,4);
            }
            return -(ulong)(uVar6 != 4);
          }
        }
        anon_unknown_0::Output("Data is incorrect.\n");
      }
      else {
        anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)_ss & 0xffffffff,0);
      }
    }
  }
  return -1;
}

Assistant:

virtual long Run()
	{
		using namespace tcu;

		for (int i = 0; i < 3; ++i)
		{
			m_program[i] = CreateComputeProgram(GenGLSL(i));
			glLinkProgram(m_program[i]);
			if (!CheckProgram(m_program[i]))
				return ERROR;
		}

		glGenBuffers(4, m_storage_buffer);
		/* storage buffer 0 */
		{
			std::vector<int> data(5 + 8 * 8 * 8);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(int)), &data[0], GL_STATIC_COPY);
		}
		/* storage buffer 1 */
		{
			const GLuint data[8] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_COPY);
		}
		/* storage buffer 2 & 3 */
		{
			std::vector<GLint> data(512, 7);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(GLint)), &data[0], GL_STATIC_COPY);

			glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2], 0,
							  (GLsizeiptr)(sizeof(GLint) * data.size() / 2));
			glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer[2],
							  (GLintptr)(sizeof(GLint) * data.size() / 2),
							  (GLsizeiptr)(sizeof(GLint) * data.size() / 2));
		}
		/* storage buffer 4 */
		{
			std::vector<mat4> data(2);
			data[0] = mat4(1);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(mat4)), &data[0], GL_STATIC_COPY);
		}
		/* counter buffer */
		{
			GLuint data[4] = { 0 };
			glGenBuffers(1, &m_counter_buffer);
			glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 1, m_counter_buffer);
			glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(data), data, GL_STATIC_COPY);
		}
		/* texture */
		{
			std::vector<vec4> data(4 * 4, vec4(0.0f));
			glGenTextures(1, &m_texture);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, 4, 4, 0, GL_RGBA, GL_FLOAT, &data[0]);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		glUseProgram(m_program[0]);
		glBindImageTexture(0, m_texture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glDispatchCompute(2, 2, 2);
		glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT | GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		glDispatchCompute(3, 2, 2);

		glUseProgram(m_program[1]);
		glDispatchCompute(4, 3, 7);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT | GL_TEXTURE_UPDATE_BARRIER_BIT |
						GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		/* validate texture */
		{
			std::vector<vec4> data(4 * 4);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glGenFramebuffers(1, &m_fbo);
			glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0);
			std::vector<GLubyte> colorData(4 * 4 * 4);
			glReadPixels(0, 0, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, &colorData[0]);
			for (int i = 0; i < 4 * 4 * 4; i += 4)
			{
				data[i / 4] =
					vec4(static_cast<GLfloat>(colorData[i] / 255.), static_cast<GLfloat>(colorData[i + 1] / 255.),
						 static_cast<GLfloat>(colorData[i + 2] / 255.), static_cast<GLfloat>(colorData[i + 3] / 255.));
			}
			for (std::size_t i = 0; i < data.size(); ++i)
			{
				if (!ColorEqual(data[i], vec4(0.25f, 0.5f, 0.75f, 1.0f), g_color_eps))
				{
					Output("Invalid data at texture.\n");
					return ERROR;
				}
			}
		}
		/* validate storage buffer 0 */
		{
			std::vector<int> data(5 + 8 * 8 * 8);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(data.size() * sizeof(int)), &data[0]);
			for (std::size_t i = 5; i < data.size(); ++i)
			{
				if (data[i] != 4)
				{
					Output("Data is: %d should be: %d.\n", data[i], 2);
					return ERROR;
				}
			}
		}
		/* validate storage buffer 1 */
		{
			GLuint data[8];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			for (GLuint i = 0; i < 4; ++i)
			{
				if (data[i] != i)
				{
					Output("Data is: %d should be: %d.\n", data[i], i);
					return ERROR;
				}
			}
		}
		/* validate storage buffer 2 & 3 */
		{
			std::vector<GLint> data(512);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[2]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(sizeof(GLint) * data.size()), &data[0]);
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != 5)
				{
					Output("Data is: %d should be: %d.\n", data[i], 5);
					return ERROR;
				}
				if (data[i + 256] != 7)
				{
					Output("Data is: %d should be: %d.\n", data[i + 256], 7);
					return ERROR;
				}
			}
		}
		/* validate storage buffer 4 */
		{
			mat4 data[2];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[3]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data[0](0, 0));
			if (data[0] != translationMatrix(vec3(10.0f, 20.0f, 30.0f)))
			{
				Output("Data is incorrect.\n");
				return ERROR;
			}
			if (data[1] != transpose(translationMatrix(vec3(10.0f, 20.0f, 30.0f))))
			{
				Output("Data is incorrect.\n");
				return ERROR;
			}
		}
		/* validate counter buffer */
		{
			GLuint data[4] = { 0 };
			glGetBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(data), data);
			if (data[3] != 4)
			{
				Output("Data is: %d should be: %d.\n", data[3], 4);
				return ERROR;
			}
		}

		return NO_ERROR;
	}